

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.upb.h
# Opt level: O2

upb_test_FakeMessageSet_Item **
upb_test_FakeMessageSet_item(upb_test_FakeMessageSet *msg,size_t *size)

{
  upb_Array *puVar1;
  upb_test_FakeMessageSet_Item **ppuVar2;
  upb_MiniTableField field;
  upb_MiniTableField local_18;
  
  local_18.number_dont_copy_me__upb_internal_use_only = 1;
  local_18.offset_dont_copy_me__upb_internal_use_only = 8;
  local_18.presence = 0;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\n';
  local_18.mode_dont_copy_me__upb_internal_use_only = 0xc1;
  puVar1 = upb_Message_GetArray(&msg->base_dont_copy_me__upb_internal_use_only,&local_18);
  if (puVar1 == (upb_Array *)0x0) {
    if (size != (size_t *)0x0) {
      *size = 0;
    }
    ppuVar2 = (upb_test_FakeMessageSet_Item **)0x0;
  }
  else {
    if (size != (size_t *)0x0) {
      *size = puVar1->size_dont_copy_me__upb_internal_use_only;
    }
    ppuVar2 = (upb_test_FakeMessageSet_Item **)
              (puVar1->data_dont_copy_me__upb_internal_use_only & 0xfffffffffffffff8);
  }
  return ppuVar2;
}

Assistant:

UPB_INLINE const upb_test_FakeMessageSet_Item* const* upb_test_FakeMessageSet_item(const upb_test_FakeMessageSet* msg, size_t* size) {
  const upb_MiniTableField field = {1, 8, 0, 0, 10, (int)kUpb_FieldMode_Array | ((int)UPB_SIZE(kUpb_FieldRep_4Byte, kUpb_FieldRep_8Byte) << kUpb_FieldRep_Shift)};
  UPB_PRIVATE(_upb_MiniTable_StrongReference)(&upb_0test__FakeMessageSet__Item_msg_init);
  const upb_Array* arr = upb_Message_GetArray(UPB_UPCAST(msg), &field);
  if (arr) {
    if (size) *size = arr->UPB_PRIVATE(size);
    return (const upb_test_FakeMessageSet_Item* const*)upb_Array_DataPtr(arr);
  } else {
    if (size) *size = 0;
    return NULL;
  }
}